

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockd.h
# Opt level: O0

int is_global_mv_block(MB_MODE_INFO *mbmi,TransformationType type)

{
  BLOCK_SIZE BVar1;
  byte bVar2;
  bool local_15;
  int block_size_allowed;
  BLOCK_SIZE bsize;
  PREDICTION_MODE mode;
  TransformationType type_local;
  MB_MODE_INFO *mbmi_local;
  
  BVar1 = mbmi->bsize;
  if (block_size_wide[BVar1] < block_size_high[BVar1]) {
    bVar2 = block_size_wide[BVar1];
  }
  else {
    bVar2 = block_size_high[BVar1];
  }
  if (((mbmi->mode == '\x0f') || (local_15 = false, mbmi->mode == '\x17')) &&
     (local_15 = false, 1 < type)) {
    local_15 = 7 < bVar2;
  }
  return (int)local_15;
}

Assistant:

static inline int is_global_mv_block(const MB_MODE_INFO *const mbmi,
                                     TransformationType type) {
  const PREDICTION_MODE mode = mbmi->mode;
  const BLOCK_SIZE bsize = mbmi->bsize;
  const int block_size_allowed =
      AOMMIN(block_size_wide[bsize], block_size_high[bsize]) >= 8;
  return (mode == GLOBALMV || mode == GLOBAL_GLOBALMV) && type > TRANSLATION &&
         block_size_allowed;
}